

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void build_obmc_prediction
               (MACROBLOCKD *xd,int rel_mi_row,int rel_mi_col,uint8_t op_mi_size,int dir,
               MB_MODE_INFO *above_mbmi,void *fun_ctxt,int num_planes)

{
  BLOCK_SIZE bsize;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  InterpFilterParams *pIVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  int *piVar17;
  scale_factors *sf;
  int x;
  long lVar18;
  ulong uVar19;
  buf_2d *pbVar20;
  MV mv;
  int_mv local_114;
  ulong local_110;
  InterPredParams local_108;
  
  iVar1 = xd->mi_row;
  iVar2 = xd->mi_col;
  local_110 = (ulong)(uint)num_planes;
  if (0 < num_planes) {
    uVar16._0_1_ = above_mbmi->bsize;
    uVar16._1_1_ = above_mbmi->partition;
    uVar16._2_1_ = above_mbmi->mode;
    uVar16._3_1_ = above_mbmi->uv_mode;
    uVar15 = 3;
    if (3 < (byte)(undefined1)uVar16) {
      uVar15 = (ulong)uVar16;
    }
    lVar5 = *(long *)((long)fun_ctxt + 8);
    lVar18 = *(long *)((long)fun_ctxt + 0x10);
    lVar6 = *(long *)((long)fun_ctxt + 0x18);
    lVar7 = *(long *)((long)fun_ctxt + 0x20);
    piVar17 = &xd->plane[0].dst.stride;
    uVar19 = 0;
    do {
      puVar8 = *(uint8_t **)(lVar5 + uVar19 * 8);
      uVar16 = (uint)((0x20005UL >> (uVar15 & 0x3f) & 1) != 0);
      if (piVar17[-8] == 0) {
        uVar16 = 0;
      }
      uVar9 = (uint)((0x10003UL >> (uVar15 & 0x3f) & 1) != 0);
      if (piVar17[-9] == 0) {
        uVar9 = 0;
      }
      iVar11 = *(int *)(lVar18 + uVar19 * 4);
      iVar3 = *(int *)(lVar7 + uVar19 * 4);
      iVar4 = *(int *)(lVar6 + uVar19 * 4);
      ((buf_2d *)(piVar17 + -6))->buf =
           puVar8 + (long)((int)((~uVar16 & rel_mi_row) << 2) >> ((byte)piVar17[-8] & 0x1f)) *
                    (long)iVar3 +
                    (long)((int)((~uVar9 & rel_mi_col) << 2) >> ((byte)piVar17[-9] & 0x1f));
      *(uint8_t **)(piVar17 + -4) = puVar8;
      piVar17[-2] = iVar11;
      piVar17[-1] = iVar4;
      *piVar17 = iVar3;
      uVar19 = uVar19 + 1;
      piVar17 = piVar17 + 0x28c;
    } while (local_110 != uVar19);
  }
  bVar14 = above_mbmi->ref_frame[0];
  lVar5 = *fun_ctxt;
  iVar11 = -1;
  if ((byte)(bVar14 - 1) < 8) {
    iVar11 = *(int *)(lVar5 + 0xf0 + (ulong)(bVar14 - 1) * 4);
  }
  if (iVar11 == -1) {
    lVar18 = 0;
  }
  else {
    lVar18 = *(long *)(lVar5 + 0x1a0 + (long)iVar11 * 8);
  }
  iVar11 = -1;
  if ((byte)(bVar14 - 1) < 8) {
    iVar11 = *(int *)(lVar5 + 0xf0 + (ulong)(bVar14 - 1) * 4);
  }
  sf = (scale_factors *)0x0;
  if (iVar11 != -1) {
    sf = (scale_factors *)(lVar5 + 0x120 + (long)iVar11 * 0x10);
  }
  xd->block_ref_scale_factors[0] = sf;
  if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
    aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                       "Reference frame has invalid dimensions");
  }
  av1_setup_pre_planes
            (xd,0,(YV12_BUFFER_CONFIG *)(lVar18 + 0x4e0),iVar1 + rel_mi_row,iVar2 + rel_mi_col,sf,
             num_planes);
  uVar15 = local_110;
  if (0 < num_planes) {
    iVar1 = xd->mi_col;
    iVar2 = xd->mi_row;
    bsize = (*xd->mi)->bsize;
    pbVar20 = xd->plane[0].pre;
    uVar19 = 0;
    do {
      if (dir == 0) {
        uVar16 = ((uint)op_mi_size << 2) >> (*(byte *)((long)(pbVar20 + -2) + 0x14) & 0x1f);
        bVar14 = *(char *)((long)(pbVar20 + -2) + 0x18) + 1;
        uVar10 = (uint)(block_size_high[bsize] >> (bVar14 & 0x1f));
        uVar9 = 0x40 >> (bVar14 & 0x1f);
        if ((int)uVar10 < (int)uVar9) {
          uVar9 = uVar10;
        }
        if (uVar10 < 4) {
          uVar9 = 4;
        }
      }
      else {
        bVar14 = *(char *)((long)(pbVar20 + -2) + 0x14) + 1;
        uVar9 = (uint)(block_size_wide[bsize] >> (bVar14 & 0x1f));
        uVar16 = 0x40 >> (bVar14 & 0x1f);
        if ((int)uVar9 < (int)uVar16) {
          uVar16 = uVar9;
        }
        if (uVar9 < 4) {
          uVar16 = 4;
        }
        uVar9 = ((uint)op_mi_size << 2) >> (*(byte *)((long)(pbVar20 + -2) + 0x18) & 0x1f);
      }
      iVar11 = av1_skip_u4x4_pred_in_obmc
                         (bsize,(macroblockd_plane *)((long)(pbVar20 + -2) + 0x10),dir);
      if (iVar11 == 0) {
        local_114 = above_mbmi->mv[0];
        local_108.subsampling_x = *(int *)((long)(pbVar20 + -2) + 0x14);
        local_108.subsampling_y = *(int *)((long)(pbVar20 + -2) + 0x18);
        local_108.pix_row = (rel_mi_row + iVar2) * 4 >> ((byte)local_108.subsampling_y & 0x1f);
        local_108.pix_col = (rel_mi_col + iVar1) * 4 >> ((byte)local_108.subsampling_x & 0x1f);
        local_108.bit_depth = xd->bd;
        local_108.scale_factors = xd->block_ref_scale_factors[0];
        uVar10 = (above_mbmi->interp_filters).as_int;
        local_108.use_hbd_buf = (uint)xd->cur_buf->flags >> 3 & 1;
        local_108.is_intrabc = 0;
        local_108.mode = TRANSLATION_PRED;
        local_108.comp_mode = UNIFORM_SINGLE;
        local_108.top = (0x120U >> ((byte)local_108.subsampling_y & 0x1f)) * -0x400 + 0x1000;
        local_108.left = (0x120U >> ((byte)local_108.subsampling_x & 0x1f)) * -0x400 + 0x1000;
        uVar12 = (ulong)(uVar10 >> 0xc & 0xff0);
        pIVar13 = (InterpFilterParams *)
                  ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar12);
        local_108.interp_filter_params[0] =
             (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar12);
        if ((char)(uVar10 >> 0x10) == '\x04') {
          local_108.interp_filter_params[0] = pIVar13;
        }
        if (4 < (int)uVar16) {
          local_108.interp_filter_params[0] = pIVar13;
        }
        uVar12 = (ulong)((uVar10 & 0xff) << 4);
        pIVar13 = (InterpFilterParams *)
                  ((long)&av1_interp_filter_params_list[0].filter_ptr + uVar12);
        local_108.interp_filter_params[1] =
             (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar12);
        if ((char)uVar10 == '\x04') {
          local_108.interp_filter_params[1] = pIVar13;
        }
        if (4 < (int)uVar9) {
          local_108.interp_filter_params[1] = pIVar13;
        }
        local_108.ref_frame_buf.buf = pbVar20->buf;
        local_108.ref_frame_buf.buf0 = pbVar20->buf0;
        local_108.ref_frame_buf.width = pbVar20->width;
        local_108.ref_frame_buf.height = pbVar20->height;
        local_108.ref_frame_buf.stride = pbVar20->stride;
        local_108.ref_frame_buf._28_4_ = *(undefined4 *)&pbVar20->field_0x1c;
        local_108.conv_params.round_0 = local_108.bit_depth + -7;
        local_108.conv_params.round_1 = 0x15 - local_108.bit_depth;
        if (local_108.bit_depth < 0xb) {
          local_108.conv_params.round_0 = 3;
          local_108.conv_params.round_1 = 0xb;
        }
        local_108.conv_params.do_average = 0;
        local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
        local_108.conv_params.dst_stride = 0;
        local_108.conv_params.plane = (int)uVar19;
        local_108.conv_params.is_compound = 0;
        local_108.conv_params.use_dist_wtd_comp_avg = 0;
        local_108.block_width = uVar16;
        local_108.block_height = uVar9;
        build_one_inter_predictor(pbVar20[-1].buf,pbVar20[-1].stride,&local_114.as_mv,&local_108);
      }
      uVar19 = uVar19 + 1;
      pbVar20 = (buf_2d *)((long)(pbVar20 + 0x51) + 0x10);
    } while (uVar15 != uVar19);
  }
  return;
}

Assistant:

static inline void build_obmc_prediction(MACROBLOCKD *xd, int rel_mi_row,
                                         int rel_mi_col, uint8_t op_mi_size,
                                         int dir, MB_MODE_INFO *above_mbmi,
                                         void *fun_ctxt, const int num_planes) {
  struct build_prediction_ctxt *ctxt = (struct build_prediction_ctxt *)fun_ctxt;
  setup_address_for_obmc(xd, rel_mi_row, rel_mi_col, above_mbmi, ctxt,
                         num_planes);

  const int mi_x = (xd->mi_col + rel_mi_col) << MI_SIZE_LOG2;
  const int mi_y = (xd->mi_row + rel_mi_row) << MI_SIZE_LOG2;

  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  InterPredParams inter_pred_params;

  for (int j = 0; j < num_planes; ++j) {
    const struct macroblockd_plane *pd = &xd->plane[j];
    int bw = 0, bh = 0;

    if (dir) {
      // prepare left reference block size
      bw = clamp(block_size_wide[bsize] >> (pd->subsampling_x + 1), 4,
                 block_size_wide[BLOCK_64X64] >> (pd->subsampling_x + 1));
      bh = (op_mi_size << MI_SIZE_LOG2) >> pd->subsampling_y;
    } else {
      // prepare above reference block size
      bw = (op_mi_size * MI_SIZE) >> pd->subsampling_x;
      bh = clamp(block_size_high[bsize] >> (pd->subsampling_y + 1), 4,
                 block_size_high[BLOCK_64X64] >> (pd->subsampling_y + 1));
    }

    if (av1_skip_u4x4_pred_in_obmc(bsize, pd, dir)) continue;

    const struct buf_2d *const pre_buf = &pd->pre[0];
    const MV mv = above_mbmi->mv[0].as_mv;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[0], pre_buf,
                          above_mbmi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, j, xd->bd);

    av1_enc_build_one_inter_predictor(pd->dst.buf, pd->dst.stride, &mv,
                                      &inter_pred_params);
  }
}